

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

undefined1  [16] __thiscall
cfd::api::ElementsTransactionApi::EstimateFee
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *utxos,ConfidentialAssetId *fee_asset,Amount *txout_fee,Amount *utxo_fee,bool is_blind,
          uint64_t effective_fee_rate,int exponent,int minimum_bits,uint32_t *append_asset_count)

{
  pointer pEVar1;
  pointer pcVar2;
  _func_int **pp_Var3;
  Script SVar4;
  Script SVar5;
  Script SVar6;
  Script SVar7;
  long lVar8;
  uint32_t uVar9;
  AddressType AVar10;
  char cVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  AddressType AVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t uVar19;
  undefined8 uVar20;
  void *pvVar21;
  CfdException *pCVar22;
  undefined1 extraout_DL;
  Amount extraout_DL_00;
  Amount extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined8 extraout_RDX;
  bool bVar23;
  Script *pSVar24;
  NetType type;
  pointer pEVar25;
  uint32_t uVar26;
  ulong uVar27;
  size_t sVar28;
  _func_int **pp_Var29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined8 uStack_848;
  uint local_840;
  uint32_t txin_size;
  uint local_838;
  uint32_t wit_size;
  byte local_830;
  undefined7 uStack_82f;
  AddressType local_828;
  FeeCalculator fee_calc;
  uint32_t local_820;
  undefined4 uStack_81c;
  undefined1 uVar32;
  undefined7 uStack_817;
  Script *in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f8;
  undefined4 uStack_804;
  int in_stack_fffffffffffff800;
  undefined4 uStack_7fc;
  pointer in_stack_fffffffffffff808;
  uint in_stack_fffffffffffff810;
  Script *local_7c8;
  ulong local_7c0;
  uint32_t rangeproof_size_cache;
  uint32_t tx_size;
  undefined4 uStack_7ac;
  void *local_798;
  void *pvStack_790;
  long local_788;
  void *local_778;
  void *pvStack_770;
  long local_768;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *local_760;
  undefined **local_758;
  _func_int **local_750;
  uint32_t tx_witness_size;
  char local_738 [16];
  undefined8 local_728;
  undefined1 local_720;
  Script claim_script;
  Script redeem_script;
  ConfidentialTxInReference ref;
  ElementsAddressFactory factory;
  DescriptorScriptData data;
  ConfidentialTransactionContext txc;
  Script local_110;
  Script local_d8;
  Script local_a0;
  Script local_68;
  
  local_760 = utxos;
  ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,tx_hex);
  local_830 = (byte)fee_asset;
  uStack_82f = (undefined7)((ulong)fee_asset >> 8);
  cVar11 = cfd::core::ConfidentialAssetId::IsEmpty();
  if (cVar11 != '\0') {
    data._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                 + 99;
    data.locking_script._vptr_Script._0_4_ = 0x228;
    data.locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "EstimateFee";
    core::logger::log<>((CfdSourceLocation *)&data,kCfdLogLevelWarning,
                        "Failed to EstimateFee. Empty fee asset.");
    pCVar22 = (CfdException *)__cxa_allocate_exception(0x30);
    data._0_8_ = &data.locking_script.script_data_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"Empty fee asset.","");
    core::CfdException::CfdException(pCVar22,kCfdIllegalArgumentError,(string *)&data);
    __cxa_throw(pCVar22,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  if (redeem_script._vptr_Script ==
      (_func_int **)
      redeem_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               *)&redeem_script);
  }
  else {
    bVar23 = false;
    uStack_81c = 0;
    pp_Var3 = redeem_script._vptr_Script;
    do {
      pp_Var29 = pp_Var3 + 0x1f;
      cfd::core::Script::Script((Script *)&data,(Script *)(pp_Var3 + 3));
      cVar11 = cfd::core::Script::IsEmpty();
      core::Script::~Script((Script *)&data);
      if (cVar11 != '\0') {
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&data,(ConfidentialAssetId *)(pp_Var3 + 10));
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        sVar28 = CONCAT71(ref.super_AbstractTxInReference.txid_._vptr_Txid._1_7_,
                          ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_);
        bVar30 = true;
        if (sVar28 == CONCAT71(claim_script.script_data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               claim_script.script_data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_)) {
          if (sVar28 == 0) {
            bVar30 = false;
          }
          else {
            iVar14 = bcmp(ref.super_AbstractTxInReference._vptr_AbstractTxInReference,
                          claim_script._vptr_Script,sVar28);
            bVar30 = iVar14 != 0;
          }
        }
        if (claim_script._vptr_Script !=
            (_func_int **)
            &claim_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(claim_script._vptr_Script);
        }
        if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
            &ref.super_AbstractTxInReference.txid_.data_) {
          operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
        }
        data._0_8_ = &PTR__ConfidentialAssetId_002b2ea0;
        if ((void *)CONCAT44(data.locking_script._vptr_Script._4_4_,
                             data.locking_script._vptr_Script._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(data.locking_script._vptr_Script._4_4_,
                                           data.locking_script._vptr_Script._0_4_));
        }
        bVar23 = true;
        if (bVar30) {
          data._0_8_ = (long)
                       "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                       + 99;
          data.locking_script._vptr_Script._0_4_ = 0x231;
          data.locking_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = "EstimateFee";
          core::logger::log<>((CfdSourceLocation *)&data,kCfdLogLevelWarning,
                              "Failed to EstimateFee. Unmatch fee asset.");
          pCVar22 = (CfdException *)__cxa_allocate_exception(0x30);
          data._0_8_ = &data.locking_script.script_data_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&data,"Unmatch fee asset.","");
          core::CfdException::CfdException(pCVar22,kCfdIllegalArgumentError,(string *)&data);
          __cxa_throw(pCVar22,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      pp_Var3 = pp_Var29;
    } while (cVar11 == '\0' &&
             pp_Var29 !=
             (_func_int **)
             redeem_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               *)&redeem_script);
    if (bVar23) goto LAB_00205a14;
  }
  data._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1);
  data.locking_script._vptr_Script._0_1_ = extraout_DL;
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)&data);
LAB_00205a14:
  wit_size = 0;
  txin_size = 0;
  uVar17 = 0;
  rangeproof_size_cache = 0;
  pEVar25 = (local_760->
            super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (local_760->
           super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar26 = 0;
  uVar18 = 0;
  local_840 = 0;
  if (pEVar25 != pEVar1) {
    local_758 = &PTR__Txid_002b2f00;
    local_750 = (_func_int **)&PTR__AddressFactory_002b3130;
    local_840 = 0;
    uVar18 = 0;
    uVar26 = 0;
    uVar17 = 0;
    do {
      cfd::core::Address::GetAddress_abi_cxx11_();
      lVar8 = CONCAT44(data.locking_script._vptr_Script._4_4_,data.locking_script._vptr_Script._0_4_
                      );
      if ((ByteData *)data._0_8_ != &data.locking_script.script_data_) {
        operator_delete((void *)data._0_8_);
      }
      if (lVar8 == 0) {
        type = kLiquidV1;
      }
      else {
        type = *(NetType *)&(pEVar25->utxo).address;
      }
      ElementsAddressFactory::ElementsAddressFactory(&factory,type);
      txin_size = 0;
      wit_size = 0;
      cfd::core::Script::Script(&claim_script);
      local_820 = 0;
      local_7c0 = 0;
      if (pEVar25->is_pegin == true) {
        local_820 = pEVar25->pegin_btc_tx_size;
        local_7c0 = (ulong)pEVar25->pegin_txoutproof_size;
        cfd::core::Script::operator=(&claim_script,&pEVar25->claim_script);
      }
      _tx_witness_size = local_738;
      pcVar2 = (pEVar25->utxo).descriptor._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_witness_size,pcVar2,
                 pcVar2 + (pEVar25->utxo).descriptor._M_string_length);
      ref.super_AbstractTxInReference._vptr_AbstractTxInReference =
           (_func_int **)&ref.super_AbstractTxInReference.txid_.data_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ref,"");
      AddressFactory::ParseOutputDescriptor
                (&data,&factory.super_AddressFactory,(string *)&tx_witness_size,(string *)&ref,
                 (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                 0x0,(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
                 (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
      if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &ref.super_AbstractTxInReference.txid_.data_) {
        operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
      cfd::core::Address::GetAddress_abi_cxx11_();
      AVar10 = data.address_type;
      if (data.address_type == kP2shP2wpkhAddress ||
          CONCAT71(ref.super_AbstractTxInReference.txid_._vptr_Txid._1_7_,
                   ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_) == 0) {
        AVar15 = data.address_type;
        if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
            &ref.super_AbstractTxInReference.txid_.data_) {
          operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
          AVar15 = data.address_type;
        }
      }
      else {
        if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
            &ref.super_AbstractTxInReference.txid_.data_) {
          operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
        }
        AVar15 = data.address_type;
        if (AVar10 != kP2shP2wshAddress) {
          AVar15 = *(AddressType *)&(pEVar25->utxo).field_0xc4;
        }
      }
      local_828 = AVar15;
      cfd::core::Script::Script(&redeem_script);
      pSVar24 = &(pEVar25->utxo).redeem_script;
      cVar11 = cfd::core::Script::IsEmpty();
      if (cVar11 != '\0') {
        cVar11 = cfd::core::Script::IsEmpty();
        if (cVar11 == '\0') {
          pSVar24 = &data.redeem_script;
        }
      }
      cfd::core::Script::operator=(&redeem_script,pSVar24);
      uVar20 = cfd::core::Script::IsEmpty();
      if ((char)uVar20 == '\0') {
        uVar20 = cfd::core::Script::IsEmpty();
        local_7c8 = &(pEVar25->utxo).scriptsig_template;
        if ((char)uVar20 != '\0') {
          local_7c8 = (Script *)0x0;
        }
      }
      else {
        local_7c8 = (Script *)0x0;
      }
      local_830 = pEVar25->is_issuance;
      local_838 = (uint)CONCAT71((int7)((ulong)uVar20 >> 8),pEVar25->is_blind_issuance);
      cfd::core::OutPoint::OutPoint
                ((OutPoint *)&stack0xfffffffffffff7e8,&(pEVar25->utxo).txid,(pEVar25->utxo).vout);
      ConfidentialTransactionContext::GetTxIn(&ref,&txc,(OutPoint *)&stack0xfffffffffffff7e8);
      uVar32 = SUB81(local_758,0);
      uStack_817 = (undefined7)((ulong)local_758 >> 8);
      if (in_stack_fffffffffffff7f0 != (Script *)0x0) {
        operator_delete(in_stack_fffffffffffff7f0);
      }
      if (pEVar25->is_issuance == true) {
        uVar27 = (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar27 == 0) {
          pvVar21 = (void *)0x0;
        }
        else {
          if ((long)uVar27 < 0) {
            std::__throw_bad_alloc();
          }
          pvVar21 = operator_new(uVar27);
        }
        uVar32 = SUB81(pvVar21,0);
        uStack_817 = (undefined7)((ulong)pvVar21 >> 8);
        in_stack_fffffffffffff7f8 = (int)(uVar27 + (long)pvVar21);
        uStack_804 = (undefined4)(uVar27 + (long)pvVar21 >> 0x20);
        sVar28 = (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (sVar28 != 0) {
          memmove(pvVar21,ref.asset_entropy_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar28);
        }
        in_stack_fffffffffffff7f0 = (Script *)((long)pvVar21 + sVar28);
        cVar11 = cfd::core::ByteData256::IsEmpty();
        if (cVar11 == '\0') {
          local_778 = (void *)0x0;
          pvStack_770 = (void *)0x0;
          local_768 = 0;
          uVar27 = (long)ref.blinding_nonce_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.blinding_nonce_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar27 == 0) {
            pvVar21 = (void *)0x0;
          }
          else {
            if ((long)uVar27 < 0) {
              std::__throw_bad_alloc();
            }
            pvVar21 = operator_new(uVar27);
          }
          local_768 = uVar27 + (long)pvVar21;
          sVar28 = (long)ref.blinding_nonce_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.blinding_nonce_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          local_778 = pvVar21;
          if (sVar28 != 0) {
            pvStack_770 = pvVar21;
            memmove(pvVar21,ref.blinding_nonce_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,sVar28);
          }
          pvStack_770 = (void *)((long)pvVar21 + sVar28);
          bVar12 = cfd::core::ByteData256::IsEmpty();
          bVar12 = bVar12 ^ 1;
        }
        else {
          bVar12 = 0;
        }
        if ((cVar11 == '\0') && (local_778 != (void *)0x0)) {
          operator_delete(local_778);
        }
        if ((void *)CONCAT71(uStack_817,uVar32) != (void *)0x0) {
          operator_delete((void *)CONCAT71(uStack_817,uVar32));
        }
      }
      else {
        if (pEVar25->is_blind_issuance == false) {
          uVar27 = (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar27 == 0) {
            pvVar21 = (void *)0x0;
          }
          else {
            if ((long)uVar27 < 0) {
              std::__throw_bad_alloc();
            }
            pvVar21 = operator_new(uVar27);
          }
          uVar32 = SUB81(pvVar21,0);
          uStack_817 = (undefined7)((ulong)pvVar21 >> 8);
          in_stack_fffffffffffff7f8 = (int)(uVar27 + (long)pvVar21);
          uStack_804 = (undefined4)(uVar27 + (long)pvVar21 >> 0x20);
          sVar28 = (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (sVar28 != 0) {
            memmove(pvVar21,ref.asset_entropy_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,sVar28);
          }
          in_stack_fffffffffffff7f0 = (Script *)((long)pvVar21 + sVar28);
          cVar11 = cfd::core::ByteData256::IsEmpty();
          if ((void *)CONCAT71(uStack_817,uVar32) != (void *)0x0) {
            operator_delete((void *)CONCAT71(uStack_817,uVar32));
          }
          if (cVar11 == '\0') {
            uVar27 = (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (uVar27 == 0) {
              pvVar21 = (void *)0x0;
            }
            else {
              if ((long)uVar27 < 0) {
                std::__throw_bad_alloc();
              }
              pvVar21 = operator_new(uVar27);
            }
            uVar32 = SUB81(pvVar21,0);
            uStack_817 = (undefined7)((ulong)pvVar21 >> 8);
            in_stack_fffffffffffff7f8 = (int)(uVar27 + (long)pvVar21);
            uStack_804 = (undefined4)(uVar27 + (long)pvVar21 >> 0x20);
            sVar28 = (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (sVar28 != 0) {
              memmove(pvVar21,ref.blinding_nonce_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,sVar28);
            }
            in_stack_fffffffffffff7f0 = (Script *)((long)pvVar21 + sVar28);
            bVar13 = cfd::core::ByteData256::IsEmpty();
            if ((void *)CONCAT71(uStack_817,uVar32) != (void *)0x0) {
              operator_delete((void *)CONCAT71(uStack_817,uVar32));
            }
            bVar12 = bVar13 ^ 1;
            local_838 = (uint)is_blind;
            if (bVar13 == 0) {
              local_838 = 1;
            }
            local_830 = 1;
            goto LAB_0020603f;
          }
        }
        bVar12 = 0;
      }
LAB_0020603f:
      uVar16 = cfd::core::ScriptWitness::GetWitnessNum();
      if (5 < uVar16) {
        uVar32 = 0x60;
        uStack_817 = 0x2b2f;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   &stack0xfffffffffffff7f0,&ref.pegin_witness_.witness_stack_);
        cfd::core::ScriptWitness::GetWitness();
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   &stack0xfffffffffffff7f0);
        local_820 = cfd::core::ByteData::GetDataSize();
        local_7c0 = cfd::core::ByteData::GetDataSize();
        cfd::core::Script::Script
                  ((Script *)&stack0xfffffffffffff7e8,
                   (ByteData *)(CONCAT44(uStack_7ac,tx_size) + 0x48));
        cfd::core::Script::operator=(&claim_script,(Script *)&stack0xfffffffffffff7e8);
        core::Script::~Script((Script *)&stack0xfffffffffffff7e8);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&tx_size);
      }
      bVar23 = pEVar25->is_issuance;
      if (bVar23 == true) {
        local_798 = (void *)0x0;
        pvStack_790 = (void *)0x0;
        local_788 = 0;
        uVar27 = (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar27 == 0) {
          pvVar21 = (void *)0x0;
        }
        else {
          if ((long)uVar27 < 0) {
            std::__throw_bad_alloc();
          }
          pvVar21 = operator_new(uVar27);
        }
        local_788 = uVar27 + (long)pvVar21;
        sVar28 = (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_798 = pvVar21;
        if (sVar28 != 0) {
          pvStack_790 = pvVar21;
          memmove(pvVar21,ref.asset_entropy_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar28);
        }
        pvStack_790 = (void *)((long)pvVar21 + sVar28);
        cVar11 = cfd::core::ByteData256::IsEmpty();
      }
      else {
        cVar11 = '\0';
      }
      if ((bVar23 != false) && (local_798 != (void *)0x0)) {
        operator_delete(local_798);
      }
      if ((cVar11 == '\0') &&
         ((pEVar25->is_pegin != true ||
          (uVar16 = cfd::core::ScriptWitness::GetWitnessNum(), 5 < uVar16)))) {
        cfd::core::Script::Script(&local_a0,&redeem_script);
        cfd::core::Script::Script(&local_68,&claim_script);
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_7c8;
        SVar5._vptr_Script = (_func_int **)&local_68;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)&wit_size;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)&wit_size >> 0x20);
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&txin_size;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)uStack_848;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_840;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = txin_size;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_838;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = wit_size;
        SVar7._vptr_Script._1_7_ = uStack_82f;
        SVar7._vptr_Script._0_1_ = local_830;
        SVar7.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = local_828;
        SVar7.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = fee_calc.baserate_;
        SVar7.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_820;
        SVar7.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_81c;
        SVar7.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar32;
        SVar7.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uStack_817;
        SVar7.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7f0;
        SVar7.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff7f8;
        SVar7.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_804;
        SVar7.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff800;
        SVar7.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_7fc;
        cfd::core::ConfidentialTxInReference::EstimateTxInSize
                  ((AddressType)&ref,SVar5,SUB41(local_828,0),(int)&local_a0,local_838 & 0xff,SVar7,
                   (Script *)(ulong)(uint)exponent,(uint *)(ulong)(uint)minimum_bits,
                   (uint *)in_stack_fffffffffffff808);
        core::Script::~Script(&local_68);
        core::Script::~Script(&local_a0);
      }
      core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
      uVar19 = uVar26 + 2;
      if (local_830 == 0) {
        uVar19 = uVar26;
      }
      if (bVar12 != 0) {
        uVar19 = uVar26 + 1;
      }
      if (txin_size == 0) {
        cfd::core::Script::Script(&local_d8,&redeem_script);
        cfd::core::Script::Script(&local_110,&claim_script);
        SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)&txin_size;
        SVar4._vptr_Script = (_func_int **)&wit_size;
        SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_1_ = bVar12;
        SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_7c8;
        SVar4.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = exponent;
        SVar4.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        SVar4.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = minimum_bits;
        SVar4.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        SVar4.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)&rangeproof_size_cache;
        SVar4.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (int)((ulong)&rangeproof_size_cache >> 0x20);
        SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)uStack_848;
        SVar6._vptr_Script = (_func_int **)local_7c0;
        SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_840;
        SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = txin_size;
        SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_838;
        SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = wit_size;
        SVar6.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = local_830;
        SVar6.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._1_7_ = uStack_82f;
        SVar6.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_828;
        SVar6.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = fee_calc.baserate_;
        SVar6.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_820;
        SVar6.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_81c;
        cfd::core::ConfidentialTxIn::EstimateTxInSize
                  (local_828,SVar4,(uint)&local_d8,SVar6,SUB41(local_820,0),SUB81(&local_110,0),
                   (uint *)(ulong)local_830,(uint *)(ulong)(byte)local_838,(bool)uVar32,
                   in_stack_fffffffffffff7f0,in_stack_fffffffffffff7f8,in_stack_fffffffffffff800,
                   (uint *)in_stack_fffffffffffff808,in_stack_fffffffffffff810);
        core::Script::~Script(&local_110);
        core::Script::~Script(&local_d8);
      }
      uVar9 = wit_size;
      local_840 = local_840 + txin_size;
      uVar17 = uVar17 + (wit_size == 0);
      core::Script::~Script(&redeem_script);
      DescriptorScriptData::~DescriptorScriptData(&data);
      if (_tx_witness_size != local_738) {
        operator_delete(_tx_witness_size);
      }
      uVar26 = uVar19 + 1;
      uVar18 = uVar18 + uVar9;
      core::Script::~Script(&claim_script);
      factory.super_AddressFactory._vptr_AddressFactory = local_750;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&factory.super_AddressFactory.prefix_list_);
      pEVar25 = pEVar25 + 1;
    } while (pEVar25 != pEVar1);
  }
  if ((uVar18 != 0 && uVar17 != 0) &&
     (uVar17 < (uint)((int)((ulong)((long)(local_760->
                                          super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_760->
                                         super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x24ca58e9))) {
    uVar18 = uVar18 + uVar17 * 4;
  }
  uVar19 = cfd::core::AbstractTransaction::GetVsizeFromSize(local_840,uVar18);
  _tx_witness_size = _tx_witness_size & 0xffffffff00000000;
  tx_size = 0;
  if ((append_asset_count != (uint32_t *)0x0) &&
     (uVar26 = uVar26 + *append_asset_count, 0xfe < uVar26)) {
    uVar26 = 0xff;
  }
  ConfidentialTransactionContext::GetSizeIgnoreTxIn
            (&txc,is_blind,&tx_witness_size,&tx_size,exponent,minimum_bits,uVar26);
  uVar26 = cfd::core::AbstractTransaction::GetVsizeFromSize(tx_size,tx_witness_size);
  FeeCalculator::FeeCalculator(&fee_calc,effective_fee_rate);
  ref.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)FeeCalculator::GetFee(&fee_calc,uVar26);
  ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_ = extraout_DL_00;
  claim_script._vptr_Script = (_func_int **)FeeCalculator::GetFee(&fee_calc,uVar19);
  claim_script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_01;
  uVar26 = cfd::core::AbstractTransaction::GetVsizeFromSize
                     (local_840 + tx_size,uVar18 + tx_witness_size);
  local_728 = FeeCalculator::GetFee(&fee_calc,uVar26);
  if (txout_fee != (Amount *)0x0) {
    txout_fee[8] = ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_;
    *(_func_int ***)txout_fee = ref.super_AbstractTxInReference._vptr_AbstractTxInReference;
  }
  if (utxo_fee != (Amount *)0x0) {
    utxo_fee[8] = claim_script.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_;
    *(_func_int ***)utxo_fee = claim_script._vptr_Script;
  }
  data._0_8_ = (long)
               "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
               + 99;
  data.locking_script._vptr_Script._0_4_ = 0x2cd;
  data.locking_script.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "EstimateFee";
  local_720 = extraout_DL_02;
  redeem_script._vptr_Script = (_func_int **)cfd::core::Amount::GetSatoshiValue();
  cfd::core::Amount::GetSatoshiValue();
  factory.super_AddressFactory._vptr_AddressFactory =
       (_func_int **)cfd::core::Amount::GetSatoshiValue();
  core::logger::log<unsigned_long&,long&,long&,long&>
            ((CfdSourceLocation *)&data,kCfdLogLevelInfo,"EstimateFee rate={} fee={} tx={} utxo={}",
             &effective_fee_rate,(long *)&redeem_script,(long *)&stack0xfffffffffffff7e8,
             (long *)&factory);
  ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  auVar31._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  auVar31[8] = local_720;
  auVar31._0_8_ = local_728;
  return auVar31;
}

Assistant:

Amount ElementsTransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<ElementsUtxoAndOption>& utxos,
    const ConfidentialAssetId& fee_asset, Amount* txout_fee, Amount* utxo_fee,
    bool is_blind, uint64_t effective_fee_rate, int exponent, int minimum_bits,
    uint32_t* append_asset_count) const {
  ConfidentialTransactionContext txc(tx_hex);

  if (fee_asset.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Empty fee asset.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty fee asset.");
  }

  // check fee in txout
  bool exist_fee = false;
  for (const auto& txout : txc.GetTxOutList()) {
    if (txout.GetLockingScript().IsEmpty()) {
      if (txout.GetAsset().GetHex() != fee_asset.GetHex()) {
        warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Unmatch fee asset.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Unmatch fee asset.");
      }
      exist_fee = true;
      break;
    }
  }
  if (!exist_fee) {
    txc.AddTxOutFee(Amount::CreateBySatoshiAmount(1), fee_asset);  // dummy fee
  }

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t txin_size = 0;
  uint32_t rangeproof_size_cache = 0;
  uint32_t asset_count = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kLiquidV1;
    if (!utxo.utxo.address.GetAddress().empty()) {
      net_type = utxo.utxo.address.GetNetType();
    }
    ElementsAddressFactory factory(net_type);

    uint32_t pegin_btc_tx_size = 0;
    uint32_t pegin_txoutproof_size = 0;
    txin_size = 0;
    wit_size = 0;
    Script claim_script;
    if (utxo.is_pegin) {
      pegin_btc_tx_size = utxo.pegin_btc_tx_size;
      pegin_txoutproof_size = utxo.pegin_txoutproof_size;
      claim_script = utxo.claim_script;
    }
    // check descriptor
    std::string descriptor = utxo.utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = factory.ParseOutputDescriptor(descriptor, "");

    AddressType addr_type;
    if (utxo.utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if ((!redeem_script.IsEmpty()) &&
        (!utxo.utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.utxo.scriptsig_template;
    }
    bool is_issuance = utxo.is_issuance;
    bool is_reissuance = false;
    bool is_blind_issuance = utxo.is_blind_issuance;
    try {
      auto ref = txc.GetTxIn(OutPoint(utxo.utxo.txid, utxo.utxo.vout));
      if (utxo.is_issuance) {
        if ((!ref.GetAssetEntropy().IsEmpty()) &&
            (!ref.GetBlindingNonce().IsEmpty())) {
          is_reissuance = true;
        }
      } else if ((!utxo.is_issuance) && (!utxo.is_blind_issuance)) {  // init
        if (!ref.GetAssetEntropy().IsEmpty()) {
          is_issuance = true;
          is_blind_issuance = is_blind;
          if (!ref.GetBlindingNonce().IsEmpty()) {
            is_reissuance = true;
            is_blind_issuance = true;
          }
        }
      }
      if (ref.GetPeginWitnessStackNum() >= 6) {
        std::vector<ByteData> pegin_stack = ref.GetPeginWitness().GetWitness();
        pegin_btc_tx_size =
            static_cast<uint32_t>(pegin_stack[4].GetDataSize());
        pegin_txoutproof_size =
            static_cast<uint32_t>(pegin_stack[5].GetDataSize());
        claim_script = Script(pegin_stack[3]);
      }

      if (utxo.is_issuance && ref.GetAssetEntropy().IsEmpty()) {
        // unmatch pattern. (using input utxo data)
      } else if (utxo.is_pegin && (ref.GetPeginWitnessStackNum() < 6)) {
        // unmatch pattern. (using input utxo data)
      } else {
        ref.EstimateTxInSize(
            addr_type, redeem_script, is_blind_issuance, exponent,
            minimum_bits, claim_script, scriptsig_template, &wit_size,
            &txin_size);
      }
    } catch (const CfdException& except) {
      info(CFD_LOG_SOURCE, "Error:{}", std::string(except.what()));
    }

    if (is_reissuance)
      ++asset_count;
    else if (is_issuance)
      asset_count += 2;

    ++asset_count;
    if (txin_size == 0) {
      ConfidentialTxIn::EstimateTxInSize(
          addr_type, redeem_script, pegin_btc_tx_size, claim_script,
          is_issuance, is_blind_issuance, &wit_size, &txin_size, is_reissuance,
          scriptsig_template, exponent, minimum_bits, &rangeproof_size_cache,
          pegin_txoutproof_size);
    }
    size += txin_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }
  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count * 4;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint32_t tx_witness_size = 0;
  uint32_t tx_size = 0;
  if (append_asset_count != nullptr) {
    if ((asset_count + *append_asset_count) < 255) {
      asset_count += *append_asset_count;
    } else {
      asset_count = 255;
    }
  }
  txc.GetSizeIgnoreTxIn(
      is_blind, &tx_witness_size, &tx_size, exponent, minimum_bits,
      asset_count);
  uint32_t tx_vsize =
      AbstractTransaction::GetVsizeFromSize(tx_size, tx_witness_size);

  FeeCalculator fee_calc(effective_fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_vsize = AbstractTransaction::GetVsizeFromSize(
      tx_size + size, tx_witness_size + witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}